

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fBasicComputeShaderTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_2::ImageBarrierCase::iterate(ImageBarrierCase *this)

{
  deUint32 *pdVar1;
  RenderContext *pRVar2;
  glUniform1uiFunc p_Var3;
  ContextType type;
  GLSLVersion version;
  int iVar4;
  GLenum GVar5;
  GLuint GVar6;
  deUint32 dVar7;
  GLint GVar8;
  uint uVar9;
  char *pcVar10;
  ostream *poVar11;
  ProgramSources *pPVar12;
  undefined4 extraout_var;
  TestLog *log;
  TestError *pTVar13;
  ulong uVar14;
  allocator<char> local_6d9;
  Texture tempTexture;
  Buffer outputBuffer;
  BufferMemMap bufMap_1;
  InterfaceVariableInfo valueInfo;
  ShaderProgram program1;
  BufferMemMap bufMap;
  ShaderProgram program0;
  ostringstream src1;
  ostringstream src0;
  Functions *gl;
  
  type.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  version = glu::getContextTypeGLSLVersion(type);
  pcVar10 = glu::getGLSLVersionDeclaration(version);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&src0);
  poVar11 = std::operator<<((ostream *)&src0,pcVar10);
  poVar11 = std::operator<<(poVar11,"\n");
  std::operator<<(poVar11,
                  "layout (local_size_x = 1) in;\nuniform uint u_baseVal;\nlayout(r32ui, binding = 2) writeonly uniform highp uimage2D u_img;\nvoid main (void) {\n    uint offset = gl_NumWorkGroups.x*gl_NumWorkGroups.y*gl_WorkGroupID.z + gl_NumWorkGroups.x*gl_WorkGroupID.y + gl_WorkGroupID.x;\n    imageStore(u_img, ivec2(gl_WorkGroupID.xy), uvec4(offset+u_baseVal, 0, 0, 0));\n}\n"
                 );
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&src1);
  poVar11 = std::operator<<(&src1.super_basic_ostream<char,_std::char_traits<char>_>,pcVar10);
  poVar11 = std::operator<<(poVar11,"\n");
  std::operator<<(poVar11,
                  "layout (local_size_x = 1) in;\nlayout(r32ui, binding = 2) readonly uniform highp uimage2D u_img;\nlayout(binding = 0) buffer Output {\n    coherent uint sum;\n};\nvoid main (void) {\n    uint value = imageLoad(u_img, ivec2(gl_WorkGroupID.xy)).x;\n    atomicAdd(sum, value);\n}\n"
                 );
  pRVar2 = ((this->super_TestCase).m_context)->m_renderCtx;
  memset(&bufMap,0,0xac);
  std::__cxx11::stringbuf::str();
  glu::ComputeSource::ComputeSource((ComputeSource *)&program1,&valueInfo.name);
  pPVar12 = glu::ProgramSources::operator<<((ProgramSources *)&bufMap,(ShaderSource *)&program1);
  glu::ShaderProgram::ShaderProgram(&program0,pRVar2,pPVar12);
  std::__cxx11::string::~string
            ((string *)
             &program1.m_shaders[0].
              super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
              super__Vector_impl_data._M_finish);
  std::__cxx11::string::~string((string *)&valueInfo);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&bufMap);
  pRVar2 = ((this->super_TestCase).m_context)->m_renderCtx;
  memset(&bufMap,0,0xac);
  std::__cxx11::stringbuf::str();
  glu::ComputeSource::ComputeSource((ComputeSource *)&valueInfo,(string *)&tempTexture);
  pPVar12 = glu::ProgramSources::operator<<((ProgramSources *)&bufMap,(ShaderSource *)&valueInfo);
  glu::ShaderProgram::ShaderProgram(&program1,pRVar2,pPVar12);
  std::__cxx11::string::~string((string *)&valueInfo.name._M_string_length);
  std::__cxx11::string::~string((string *)&tempTexture);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&bufMap);
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar4);
  glu::TypedObjectWrapper<(glu::ObjectType)0>::TypedObjectWrapper
            (&tempTexture,((this->super_TestCase).m_context)->m_renderCtx);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            (&outputBuffer,((this->super_TestCase).m_context)->m_renderCtx);
  log = glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                        &program0);
  glu::operator<<(log,&program1);
  if ((program0.m_program.m_info.linkOk != true) || (program1.m_program.m_info.linkOk == false)) {
    pTVar13 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar13,"Compile failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
               ,0x582);
    __cxa_throw(pTVar13,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  bufMap.m_gl = (Functions *)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log
  ;
  pdVar1 = &bufMap.m_target;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar1);
  std::operator<<((ostream *)pdVar1,"Work groups: ");
  tcu::operator<<((ostream *)pdVar1,&this->m_workSize);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&bufMap,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pdVar1);
  (*gl->bindTexture)(0xde1,tempTexture.super_ObjectWrapper.m_object);
  (*gl->texStorage2D)(0xde1,1,0x8236,(this->m_workSize).m_data[0],(this->m_workSize).m_data[1]);
  (*gl->texParameteri)(0xde1,0x2801,0x2600);
  (*gl->texParameteri)(0xde1,0x2800,0x2600);
  GVar5 = (*gl->getError)();
  glu::checkError(GVar5,"Uploading image data failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                  ,0x58b);
  (*gl->bindImageTexture)(2,tempTexture.super_ObjectWrapper.m_object,0,'\0',0,0x88ba,0x8236);
  GVar5 = (*gl->getError)();
  glu::checkError(GVar5,"Image setup failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                  ,0x58f);
  GVar6 = (*gl->getProgramResourceIndex)(program1.m_program.m_program,0x92e6,"Output");
  dVar7 = glu::getProgramResourceUint(gl,program1.m_program.m_program,0x92e6,GVar6,0x9303);
  (*gl->bindBuffer)(0x90d2,outputBuffer.super_ObjectWrapper.m_object);
  (*gl->bufferData)(0x90d2,(long)(int)dVar7,(void *)0x0,0x88e1);
  BufferMemMap::BufferMemMap(&bufMap,gl,0x90d2,0,dVar7,2);
  memset(bufMap.m_ptr,0,(long)(int)dVar7);
  BufferMemMap::~BufferMemMap(&bufMap);
  (*gl->bindBufferBase)(0x90d2,0,outputBuffer.super_ObjectWrapper.m_object);
  GVar5 = (*gl->getError)();
  glu::checkError(GVar5,"Output buffer setup failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                  ,0x59f);
  (*gl->useProgram)(program0.m_program.m_program);
  p_Var3 = gl->uniform1ui;
  GVar8 = (*gl->getUniformLocation)(program0.m_program.m_program,"u_baseVal");
  (*p_Var3)(GVar8,0x7f);
  (*gl->dispatchCompute)((this->m_workSize).m_data[0],(this->m_workSize).m_data[1],1);
  (*gl->memoryBarrier)(0x20);
  (*gl->useProgram)(program1.m_program.m_program);
  (*gl->dispatchCompute)((this->m_workSize).m_data[0],(this->m_workSize).m_data[1],1);
  GVar5 = (*gl->getError)();
  glu::checkError(GVar5,"Failed to dispatch commands",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                  ,0x5a9);
  GVar6 = (*gl->getProgramResourceIndex)(program1.m_program.m_program,0x92e6,"Output");
  dVar7 = glu::getProgramResourceUint(gl,program1.m_program.m_program,0x92e6,GVar6,0x9303);
  GVar6 = (*gl->getProgramResourceIndex)(program1.m_program.m_program,0x92e5,"sum");
  glu::getProgramInterfaceVariableInfo(&valueInfo,gl,program1.m_program.m_program,0x92e5,GVar6);
  uVar14 = 0;
  BufferMemMap::BufferMemMap(&bufMap_1,gl,0x90d2,0,dVar7,1);
  uVar9 = (this->m_workSize).m_data[1] * (this->m_workSize).m_data[0];
  if (0 < (int)uVar9) {
    uVar14 = (ulong)uVar9;
  }
  if (*(int *)((long)bufMap_1.m_ptr + (ulong)valueInfo.offset) ==
      (int)uVar14 * 0x7f + (int)(((int)uVar14 - 1) * uVar14 >> 1)) {
    BufferMemMap::~BufferMemMap(&bufMap_1);
    std::__cxx11::string::~string((string *)&valueInfo);
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
    glu::ObjectWrapper::~ObjectWrapper(&outputBuffer.super_ObjectWrapper);
    glu::ObjectWrapper::~ObjectWrapper(&tempTexture.super_ObjectWrapper);
    glu::ShaderProgram::~ShaderProgram(&program1);
    glu::ShaderProgram::~ShaderProgram(&program0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src1);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src0);
    return STOP;
  }
  bufMap.m_gl = (Functions *)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log
  ;
  pdVar1 = &bufMap.m_target;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar1);
  std::operator<<((ostream *)pdVar1,"ERROR: comparison failed, expected ");
  std::ostream::_M_insert<unsigned_long>((ulong)pdVar1);
  std::operator<<((ostream *)pdVar1,", got ");
  std::ostream::_M_insert<unsigned_long>((ulong)pdVar1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&bufMap,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pdVar1);
  pTVar13 = (TestError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bufMap,"Comparison failed",&local_6d9);
  tcu::TestError::TestError(pTVar13,(string *)&bufMap);
  __cxa_throw(pTVar13,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

IterateResult iterate (void)
	{
		const GLSLVersion			glslVersion				= glu::getContextTypeGLSLVersion(m_context.getRenderContext().getType());
		const char* const			glslVersionDeclaration	= getGLSLVersionDeclaration(glslVersion);

		std::ostringstream src0;
		src0 << glslVersionDeclaration << "\n"
			 << "layout (local_size_x = 1) in;\n"
						  "uniform uint u_baseVal;\n"
						  "layout(r32ui, binding = 2) writeonly uniform highp uimage2D u_img;\n"
						  "void main (void) {\n"
						  "    uint offset = gl_NumWorkGroups.x*gl_NumWorkGroups.y*gl_WorkGroupID.z + gl_NumWorkGroups.x*gl_WorkGroupID.y + gl_WorkGroupID.x;\n"
						  "    imageStore(u_img, ivec2(gl_WorkGroupID.xy), uvec4(offset+u_baseVal, 0, 0, 0));\n"
				"}\n";

		std::ostringstream src1;
		src1 << glslVersionDeclaration << "\n"
			 << "layout (local_size_x = 1) in;\n"
						  "layout(r32ui, binding = 2) readonly uniform highp uimage2D u_img;\n"
						  "layout(binding = 0) buffer Output {\n"
						  "    coherent uint sum;\n"
						  "};\n"
						  "void main (void) {\n"
						  "    uint value = imageLoad(u_img, ivec2(gl_WorkGroupID.xy)).x;\n"
						  "    atomicAdd(sum, value);\n"
				"}\n";

		const ShaderProgram			program0		(m_context.getRenderContext(), ProgramSources() << ComputeSource(src0.str()));
		const ShaderProgram			program1		(m_context.getRenderContext(), ProgramSources() << ComputeSource(src1.str()));

		const glw::Functions&		gl				= m_context.getRenderContext().getFunctions();
		const Texture				tempTexture		(m_context.getRenderContext());
		const Buffer				outputBuffer	(m_context.getRenderContext());
		const deUint32				baseValue		= 127;

		m_testCtx.getLog() << program0 << program1;
		if (!program0.isOk() || !program1.isOk())
			TCU_FAIL("Compile failed");

		m_testCtx.getLog() << TestLog::Message << "Work groups: " << m_workSize << TestLog::EndMessage;

		// Temp texture setup
		gl.bindTexture(GL_TEXTURE_2D, *tempTexture);
		gl.texStorage2D(GL_TEXTURE_2D, 1, GL_R32UI, m_workSize[0], m_workSize[1]);
		gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Uploading image data failed");

		// Bind to unit 2
		gl.bindImageTexture(2, *tempTexture, 0, GL_FALSE, 0, GL_READ_WRITE, GL_R32UI);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Image setup failed");

		// Output buffer setup
		{
			const deUint32		blockIndex		= gl.getProgramResourceIndex(program1.getProgram(), GL_SHADER_STORAGE_BLOCK, "Output");
			const int			blockSize		= getProgramResourceInt(gl, program1.getProgram(), GL_SHADER_STORAGE_BLOCK, blockIndex, GL_BUFFER_DATA_SIZE);

			gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, *outputBuffer);
			gl.bufferData(GL_SHADER_STORAGE_BUFFER, blockSize, DE_NULL, GL_STREAM_READ);

			{
				const BufferMemMap bufMap(gl, GL_SHADER_STORAGE_BUFFER, 0, blockSize, GL_MAP_WRITE_BIT);
				deMemset(bufMap.getPtr(), 0, blockSize);
			}

			gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, *outputBuffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Output buffer setup failed");
		}

		// Dispatch compute workload
		gl.useProgram(program0.getProgram());
		gl.uniform1ui(gl.getUniformLocation(program0.getProgram(), "u_baseVal"), baseValue);
		gl.dispatchCompute(m_workSize[0], m_workSize[1], 1);
		gl.memoryBarrier(GL_SHADER_IMAGE_ACCESS_BARRIER_BIT);
		gl.useProgram(program1.getProgram());
		gl.dispatchCompute(m_workSize[0], m_workSize[1], 1);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to dispatch commands");

		// Read back and compare
		{
			const deUint32				blockIndex	= gl.getProgramResourceIndex(program1.getProgram(), GL_SHADER_STORAGE_BLOCK, "Output");
			const int					blockSize	= getProgramResourceInt(gl, program1.getProgram(), GL_SHADER_STORAGE_BLOCK, blockIndex, GL_BUFFER_DATA_SIZE);
			const deUint32				valueIndex	= gl.getProgramResourceIndex(program1.getProgram(), GL_BUFFER_VARIABLE, "sum");
			const InterfaceVariableInfo	valueInfo	= getProgramInterfaceVariableInfo(gl, program1.getProgram(), GL_BUFFER_VARIABLE, valueIndex);
			const BufferMemMap			bufMap		(gl, GL_SHADER_STORAGE_BUFFER, 0, blockSize, GL_MAP_READ_BIT);

			const deUint32				res			= *((const deUint32*)((const deUint8*)bufMap.getPtr() + valueInfo.offset));
			deUint32					ref			= 0;

			for (int ndx = 0; ndx < m_workSize[0]*m_workSize[1]; ndx++)
				ref += baseValue + (deUint32)ndx;

			if (res != ref)
			{
				m_testCtx.getLog() << TestLog::Message << "ERROR: comparison failed, expected " << ref << ", got " << res << TestLog::EndMessage;
				throw tcu::TestError("Comparison failed");
			}
		}

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}